

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_action(lysp_yin_ctx *ctx,tree_node_meta *act_meta)

{
  lysp_node *plVar1;
  uint16_t uVar2;
  ly_stmt current_element;
  LY_ERR LVar3;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar4;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  ly_stmt kw;
  size_t subelems_size;
  yin_subelement *subelems;
  lysp_node **pplStack_58;
  LY_ERR ret;
  lysp_node_action **acts;
  lysp_node_action *act;
  tree_node_meta *act_meta_local;
  lysp_yin_ctx *ctx_local;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  pplStack_58 = act_meta->nodes;
  subelems._4_4_ = 0;
  subelems_size = 0;
  current_element = LY_STMT_RPC;
  if (act_meta->parent != (lysp_node *)0x0) {
    current_element = LY_STMT_ACTION;
  }
  act = (lysp_node_action *)act_meta;
  act_meta_local = (tree_node_meta *)ctx;
  acts = (lysp_node_action **)calloc(1,0x110);
  if ((lysp_node *)acts == (lysp_node *)0x0) {
    ly_log((ly_ctx *)*act_meta_local[4].nodes,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "yin_parse_action");
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    if (*pplStack_58 == (lysp_node *)0x0) {
      *pplStack_58 = (lysp_node *)acts;
    }
    else {
      plVar1 = *pplStack_58;
      while (_ret___1 = (long *)((long)plVar1 + (long)*pplStack_58 + (0x10 - (long)*pplStack_58)),
            *_ret___1 != 0) {
        plVar1 = (lysp_node *)*_ret___1;
      }
      *_ret___1 = (long)acts;
    }
    uVar2 = 0x100;
    if ((act->field_0).node.parent != (lysp_node *)0x0) {
      uVar2 = 0x200;
    }
    ((lysp_node *)acts)->nodetype = uVar2;
    ((lysp_node *)acts)->parent = (act->field_0).node.parent;
    ctx_local._4_4_ = lyxml_ctx_next((lyxml_ctx *)act_meta_local[4].nodes);
    if (((ctx_local._4_4_ == LY_SUCCESS) &&
        (ctx_local._4_4_ =
              yin_parse_attribute((lysp_yin_ctx *)act_meta_local,YIN_ARG_NAME,(char **)(acts + 3),
                                  Y_IDENTIF_ARG,current_element), ctx_local._4_4_ == LY_SUCCESS)) &&
       (ctx_local._4_4_ =
             subelems_allocator((lysp_yin_ctx *)act_meta_local,9,(lysp_node *)acts,
                                (yin_subelement **)&subelems_size,0x80000,acts + 4,CONCAT44(uVar4,2)
                                ,0x800,acts + 9,0,0x130000,acts + 6,0,2,acts + 10,2,4,acts + 0x16,2,
                                0x270000,acts + 5,2,0x2c0000,(long)acts + 10,2,0x2f0000,acts + 8,0,
                                0xf0000,0,0), ctx_local._4_4_ == LY_SUCCESS)) {
      subelems._4_4_ =
           yin_parse_content((lysp_yin_ctx *)act_meta_local,(yin_subelement *)subelems_size,9,acts,
                             current_element,(char **)0x0,(lysp_ext_instance **)(acts + 7));
      subelems_deallocator(9,(yin_subelement *)subelems_size);
      if (subelems._4_4_ == LY_SUCCESS) {
        if (*(short *)(acts + 0xb) == 0) {
          *(undefined2 *)(acts + 0xb) = 0x1000;
          acts[10] = (lysp_node_action *)acts;
          if (act_meta_local == (tree_node_meta *)0x0) {
            local_b8 = (ly_ctx *)0x0;
          }
          else {
            local_b8 = (ly_ctx *)
                       (&act_meta_local[3].nodes[1]->parent)
                       [*(int *)((long)act_meta_local[3].nodes + 4) - 1]->parent->parent;
          }
          LVar3 = lydict_insert(local_b8,"input",0,(char **)(acts + 0xd));
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        if (*(short *)(acts + 0x17) == 0) {
          *(undefined2 *)(acts + 0x17) = 0x2000;
          acts[0x16] = (lysp_node_action *)acts;
          if (act_meta_local == (tree_node_meta *)0x0) {
            local_c0 = (ly_ctx *)0x0;
          }
          else {
            local_c0 = (ly_ctx *)
                       (&act_meta_local[3].nodes[1]->parent)
                       [*(int *)((long)act_meta_local[3].nodes + 4) - 1]->parent->parent;
          }
          LVar3 = lydict_insert(local_c0,"output",0,(char **)(acts + 0x19));
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        ctx_local._4_4_ =
             yin_unres_exts_add((lysp_yin_ctx *)act_meta_local,(lysp_ext_instance *)acts[7]);
        if (ctx_local._4_4_ == LY_SUCCESS) {
          ctx_local._4_4_ = LY_SUCCESS;
        }
      }
      else {
        ctx_local._4_4_ = subelems._4_4_;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_action(struct lysp_yin_ctx *ctx, struct tree_node_meta *act_meta)
{
    struct lysp_node_action *act, **acts = (struct lysp_node_action **)act_meta->nodes;
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    size_t subelems_size;
    enum ly_stmt kw = act_meta->parent ? LY_STMT_ACTION : LY_STMT_RPC;

    /* create new action */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, acts, act, next, LY_EMEM);
    act->nodetype = act_meta->parent ? LYS_ACTION : LYS_RPC;
    act->parent = act_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &act->name, Y_IDENTIF_ARG, kw));

    /* parse content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 9, (struct lysp_node *)act, &subelems,
            LY_STMT_DESCRIPTION, &act->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_GROUPING, &act->groupings, 0,
            LY_STMT_IF_FEATURE, &act->iffeatures, 0,
            LY_STMT_INPUT, &act->input, YIN_SUBELEM_UNIQUE,
            LY_STMT_OUTPUT, &act->output, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &act->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &act->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_TYPEDEF, &act->typedefs, 0,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = (yin_parse_content(ctx, subelems, subelems_size, act, kw, NULL, &act->exts));
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* always initialize inout, they are technically present (needed for later deviations/refines) */
    if (!act->input.nodetype) {
        act->input.nodetype = LYS_INPUT;
        act->input.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "input", 0, &act->input.name));
    }
    if (!act->output.nodetype) {
        act->output.nodetype = LYS_OUTPUT;
        act->output.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "output", 0, &act->output.name));
    }

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, act->exts));

    return LY_SUCCESS;
}